

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

int luv_cwd(lua_State *L)

{
  int status;
  char local_2028 [4];
  int ret;
  char path [8192];
  size_t local_20;
  size_t size;
  lua_State *L_local;
  
  local_20 = 0x2000;
  size = (size_t)L;
  status = uv_cwd(local_2028,&local_20);
  if (status < 0) {
    L_local._4_4_ = luv_error((lua_State *)size,status);
  }
  else {
    lua_pushlstring((lua_State *)size,local_2028,local_20);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_cwd(lua_State* L) {
  size_t size = 2*PATH_MAX;
  char path[2*PATH_MAX];
  int ret = uv_cwd(path, &size);
  if (ret < 0) return luv_error(L, ret);
  lua_pushlstring(L, path, size);
  return 1;
}